

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O2

void __thiscall antlr::CommonAST::CommonAST(CommonAST *this,CommonAST *other)

{
  (this->super_BaseAST).right.ref = (ASTRef *)0x0;
  (this->super_BaseAST).super_AST.ref = (ASTRef *)0x0;
  (this->super_BaseAST).down.ref = (ASTRef *)0x0;
  (this->super_BaseAST).super_AST._vptr_AST = (_func_int **)&PTR__CommonAST_002c1b60;
  this->ttype = other->ttype;
  std::__cxx11::string::string((string *)&this->text,(string *)&other->text);
  return;
}

Assistant:

CommonAST( const CommonAST& other )
	: BaseAST(other)
	, ttype(other.ttype)
	, text(other.text)
	{
	}